

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::flush
          (xml_buffered_writer *this,char_t *data,size_t size)

{
  anon_union_8192_4_fbc60714_for_scratch *paVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  xml_encoding xVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  value_type i;
  anon_union_8192_4_fbc60714_for_scratch *paVar6;
  anon_union_8192_4_fbc60714_for_scratch *paVar7;
  uint uVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  
  if (size == 0) {
    return;
  }
  xVar5 = this->encoding;
  if (xVar5 == encoding_utf8) {
    UNRECOVERED_JUMPTABLE = this->writer->_vptr_xml_writer[2];
    (*UNRECOVERED_JUMPTABLE)(this->writer,data,size,UNRECOVERED_JUMPTABLE);
    return;
  }
  paVar1 = &this->scratch;
  paVar7 = paVar1;
  if ((xVar5 & ~encoding_utf8) != encoding_utf16_le) {
    if (xVar5 - encoding_utf32_le < 2) {
      paVar7 = (anon_union_8192_4_fbc60714_for_scratch *)
               utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf32_writer>
                         (data,size,paVar1);
      paVar6 = paVar1;
      if (xVar5 != encoding_utf32_le) {
        for (; paVar6 != paVar7;
            paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar6 + 4)) {
          uVar8 = paVar6->data_u32[0];
          paVar6->data_u32[0] =
               uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        }
      }
LAB_0012a6af:
      lVar11 = (long)paVar7 - (long)paVar1;
    }
    else {
      if (xVar5 == encoding_latin1) {
LAB_0012a6e0:
        do {
          puVar9 = (uint *)data;
          lVar10 = 0;
          lVar11 = 3;
          while( true ) {
            if (size + lVar10 == 0) goto LAB_0012a6af;
            bVar3 = *(byte *)((long)puVar9 + lVar11 + -3);
            if (-1 < (char)bVar3) {
              paVar7->data_u8[0] = bVar3;
              paVar7 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar7->data_u8 + 1);
              data = (char_t *)((long)puVar9 + (1 - lVar10));
              size = (size + lVar10) - 1;
              if ((size < 4) || ((((int)puVar9 - (int)lVar10) + 1U & 3) != 0)) goto LAB_0012a6e0;
              goto LAB_0012a7f0;
            }
            if ((((2 < size + lVar10) && ((bVar3 & 0xf0) == 0xe0)) &&
                (bVar14 = *(byte *)((long)puVar9 + lVar11 + -2), (bVar14 & 0xc0) == 0x80)) &&
               (bVar4 = *(byte *)((long)puVar9 + lVar11 + -1), (bVar4 & 0xc0) == 0x80)) break;
            lVar10 = lVar10 + -1;
            lVar11 = lVar11 + 1;
          }
          uVar8 = (uint)bVar14 << 6;
          bVar14 = bVar4 & 0x3f | (byte)uVar8;
          if ((uVar8 & 0xf00) != 0 || (bVar3 & 0xf) != 0) {
            bVar14 = 0x3f;
          }
          paVar7->data_u8[0] = bVar14;
          paVar7 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar7 + 1);
          size = (size + lVar10) - 3;
          data = (char_t *)((long)puVar9 + (3 - lVar10));
        } while( true );
      }
      lVar11 = 0;
    }
    (*this->writer->_vptr_xml_writer[2])(this->writer,paVar1,lVar11);
    return;
  }
LAB_0012a440:
  do {
    puVar9 = (uint *)data;
    lVar10 = 0;
    lVar11 = 3;
    while( true ) {
      uVar2 = size + lVar10;
      if (uVar2 == 0) {
        paVar6 = paVar1;
        if (xVar5 != encoding_utf16_le) {
          for (; paVar6 != paVar7;
              paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar6 + 2)) {
            paVar6->data_u16[0] = paVar6->data_u16[0] << 8 | paVar6->data_u16[0] >> 8;
          }
        }
        goto LAB_0012a6af;
      }
      bVar3 = *(byte *)((long)puVar9 + lVar11 + -3);
      uVar8 = (uint)bVar3;
      if (-1 < (char)bVar3) {
        *(ushort *)paVar7 = (ushort)bVar3;
        paVar7 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar7->data_u16 + 1);
        data = (char_t *)((long)puVar9 + (1 - lVar10));
        size = (size + lVar10) - 1;
        if ((size < 4) || ((((int)puVar9 - (int)lVar10) + 1U & 3) != 0)) goto LAB_0012a440;
        goto LAB_0012a56c;
      }
      if (((uVar2 != 1) && ((uVar8 & 0xffffffe0) == 0xc0)) &&
         (bVar14 = *(byte *)((long)puVar9 + lVar11 + -2), (bVar14 & 0xc0) == 0x80)) {
        paVar7->data_u16[0] = bVar14 & 0x3f | (ushort)((uVar8 & 0x1f) << 6);
        paVar7 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar7 + 2);
        size = (size + lVar10) - 2;
        data = (char_t *)((long)puVar9 + (2 - lVar10));
        goto LAB_0012a440;
      }
      if ((((2 < uVar2) && ((uVar8 & 0xfffffff0) == 0xe0)) &&
          (bVar14 = *(byte *)((long)puVar9 + lVar11 + -2), (bVar14 & 0xc0) == 0x80)) &&
         (bVar4 = *(byte *)((long)puVar9 + lVar11 + -1), (bVar4 & 0xc0) == 0x80)) {
        paVar7->data_u16[0] = bVar4 & 0x3f | (bVar14 & 0x3f) << 6 | (ushort)bVar3 << 0xc;
        paVar7 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar7 + 2);
        size = (size + lVar10) - 3;
        data = (char_t *)((long)puVar9 + (3 - lVar10));
        goto LAB_0012a440;
      }
      if (((3 < uVar2) && ((uVar8 & 0xfffffff8) == 0xf0)) &&
         ((uVar12 = (uint)*(byte *)((long)puVar9 + lVar11 + -2), (uVar12 & 0xffffffc0) == 0x80 &&
          ((bVar3 = *(byte *)((long)puVar9 + lVar11 + -1), (bVar3 & 0xc0) == 0x80 &&
           (bVar14 = *(byte *)((long)puVar9 + lVar11), (bVar14 & 0xc0) == 0x80)))))) break;
      lVar10 = lVar10 + -1;
      lVar11 = lVar11 + 1;
    }
    uVar13 = (uint)bVar3 << 6;
    paVar7->data_u16[0] =
         (short)((uVar13 & 0xc00) + ((uVar12 & 0x3f) << 0xc | (uVar8 & 7) << 0x12) + 0x3ff0000 >> 10
                ) + 0xd800;
    paVar7->data_u16[1] = bVar14 & 0x3f | (ushort)uVar13 & 0x3ff | 0xdc00;
    paVar7 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar7 + 4);
    size = (size + lVar10) - 4;
    data = (char_t *)((long)puVar9 + (4 - lVar10));
  } while( true );
  while( true ) {
    paVar7->data_u8[0] = (byte)*(uint *)data;
    paVar7->data_u8[1] = *(byte *)((long)data + 1);
    paVar7->data_u8[2] = *(byte *)((long)data + 2);
    paVar7->data_u8[3] = *(byte *)((long)data + 3);
    paVar7 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar7->data_u8 + 4);
    data = (char_t *)((long)data + 4);
    size = size - 4;
    if (size < 4) break;
LAB_0012a7f0:
    if ((*(uint *)data & 0x80808080) != 0) break;
  }
  goto LAB_0012a6e0;
  while( true ) {
    paVar7->data_u16[0] = (ushort)*(uint *)data & 0x7f;
    *(ushort *)((long)paVar7 + 2) = (ushort)*(byte *)((long)data + 1);
    *(ushort *)((long)paVar7 + 4) = (ushort)*(byte *)((long)data + 2);
    *(ushort *)((long)paVar7 + 6) = (ushort)*(byte *)((long)data + 3);
    paVar7 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar7->data_u16 + 4);
    data = (char_t *)((long)data + 4);
    size = size - 4;
    if (size < 4) break;
LAB_0012a56c:
    if ((*(uint *)data & 0x80808080) != 0) break;
  }
  goto LAB_0012a440;
}

Assistant:

void flush(const char_t* data, size_t size)
		{
			if (size == 0) return;

			// fast path, just write data
			if (encoding == get_write_native_encoding())
				writer.write(data, size * sizeof(char_t));
			else
			{
				// convert chunk
				size_t result = convert_buffer_output(scratch.data_char, scratch.data_u8, scratch.data_u16, scratch.data_u32, data, size, encoding);
				assert(result <= sizeof(scratch));

				// write data
				writer.write(scratch.data_u8, result);
			}
		}